

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O0

void Gia_ManStaticFanoutStart(Gia_Man_t *p)

{
  int *piVar1;
  int *pArray;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_34;
  int iFanout;
  int i;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pObj;
  int *pRefsOld;
  Vec_Int_t *vCounts;
  Gia_Man_t *p_local;
  
  if (p->vFanoutNums != (Vec_Int_t *)0x0) {
    __assert_fail("p->vFanoutNums == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                  ,0xf4,"void Gia_ManStaticFanoutStart(Gia_Man_t *)");
  }
  if (p->vFanout != (Vec_Int_t *)0x0) {
    __assert_fail("p->vFanout == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                  ,0xf5,"void Gia_ManStaticFanoutStart(Gia_Man_t *)");
  }
  piVar1 = p->pRefs;
  p->pRefs = (int *)0x0;
  Gia_ManCreateRefs(p);
  pArray = p->pRefs;
  iVar2 = Gia_ManObjNum(p);
  pVVar4 = Vec_IntAllocArray(pArray,iVar2);
  p->vFanoutNums = pVVar4;
  p->pRefs = piVar1;
  pVVar4 = Gia_ManStartFanoutMap(p,p->vFanoutNums);
  p->vFanout = pVVar4;
  iVar2 = Gia_ManObjNum(p);
  pVVar4 = Vec_IntStart(iVar2);
  local_34 = 0;
  do {
    bVar6 = false;
    if (local_34 < p->nObjs) {
      pFanin = Gia_ManObj(p,local_34);
      bVar6 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) {
      local_34 = 0;
      while( true ) {
        bVar6 = false;
        if (local_34 < p->nObjs) {
          pFanin = Gia_ManObj(p,local_34);
          bVar6 = pFanin != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        iVar2 = Vec_IntEntry(pVVar4,local_34);
        iVar3 = Gia_ObjFanoutNum(p,pFanin);
        if (iVar2 != iVar3) {
          __assert_fail("Vec_IntEntry(vCounts, i) == Gia_ObjFanoutNum(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                        ,0x11a,"void Gia_ManStaticFanoutStart(Gia_Man_t *)");
        }
        local_34 = local_34 + 1;
      }
      Vec_IntFree(pVVar4);
      return;
    }
    iVar2 = Gia_ObjIsAnd(pFanin);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsCo(pFanin);
      if (iVar2 != 0) goto LAB_0020bd74;
    }
    else {
LAB_0020bd74:
      pGVar5 = Gia_ObjFanin0(pFanin);
      iVar2 = Gia_ObjId(p,pGVar5);
      iVar2 = Vec_IntEntry(pVVar4,iVar2);
      Gia_ObjSetFanout(p,pGVar5,iVar2,pFanin);
      iVar2 = Gia_ObjId(p,pGVar5);
      Vec_IntAddToEntry(pVVar4,iVar2,1);
    }
    iVar2 = Gia_ObjIsAnd(pFanin);
    if (iVar2 != 0) {
      iVar2 = Gia_ObjIsBuf(pFanin);
      if (iVar2 == 0) {
        pGVar5 = Gia_ObjFanin1(pFanin);
        iVar2 = Gia_ObjId(p,pGVar5);
        iVar2 = Vec_IntEntry(pVVar4,iVar2);
        Gia_ObjSetFanout(p,pGVar5,iVar2,pFanin);
        iVar2 = Gia_ObjId(p,pGVar5);
        Vec_IntAddToEntry(pVVar4,iVar2,1);
      }
    }
    iVar2 = Gia_ObjIsMux(p,pFanin);
    if (iVar2 != 0) {
      pGVar5 = Gia_ObjFanin2(p,pFanin);
      iVar2 = Gia_ObjId(p,pGVar5);
      iVar2 = Vec_IntEntry(pVVar4,iVar2);
      Gia_ObjSetFanout(p,pGVar5,iVar2,pFanin);
      iVar2 = Gia_ObjId(p,pGVar5);
      Vec_IntAddToEntry(pVVar4,iVar2,1);
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void Gia_ManStaticFanoutStart( Gia_Man_t * p )
{
    Vec_Int_t * vCounts;
    int * pRefsOld;
    Gia_Obj_t * pObj, * pFanin;
    int i, iFanout;
    assert( p->vFanoutNums == NULL );
    assert( p->vFanout == NULL );
    // recompute reference counters
    pRefsOld = p->pRefs; p->pRefs = NULL;
    Gia_ManCreateRefs(p);
    p->vFanoutNums = Vec_IntAllocArray( p->pRefs, Gia_ManObjNum(p) );
    p->pRefs = pRefsOld;
    // start the fanout maps
    p->vFanout = Gia_ManStartFanoutMap( p, p->vFanoutNums );
    // incrementally add fanouts
    vCounts = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
        {
            pFanin = Gia_ObjFanin0(pObj);
            iFanout = Vec_IntEntry( vCounts, Gia_ObjId(p, pFanin) );
            Gia_ObjSetFanout( p, pFanin, iFanout, pObj );
            Vec_IntAddToEntry( vCounts, Gia_ObjId(p, pFanin), 1 );
        }
        if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsBuf(pObj) )
        {
            pFanin = Gia_ObjFanin1(pObj);
            iFanout = Vec_IntEntry( vCounts, Gia_ObjId(p, pFanin) );
            Gia_ObjSetFanout( p, pFanin, iFanout, pObj );
            Vec_IntAddToEntry( vCounts, Gia_ObjId(p, pFanin), 1 );
        }
        if ( Gia_ObjIsMux(p, pObj) )
        {

            pFanin = Gia_ObjFanin2(p, pObj);
            iFanout = Vec_IntEntry( vCounts, Gia_ObjId(p, pFanin) );
            Gia_ObjSetFanout( p, pFanin, iFanout, pObj );
            Vec_IntAddToEntry( vCounts, Gia_ObjId(p, pFanin), 1 );
        }
    }
    // double-check the current number of fanouts added
    Gia_ManForEachObj( p, pObj, i )
        assert( Vec_IntEntry(vCounts, i) == Gia_ObjFanoutNum(p, pObj) );
    Vec_IntFree( vCounts );
}